

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::ByteSizeLong
          (RandomBernoulliStaticLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  
  uVar3 = (this->outputshape_).current_size_;
  uVar5 = 0;
  if ((int)uVar3 < 1) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,(int)uVar5);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar6 = lVar6 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      uVar7 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar7;
    } while (uVar3 != uVar7);
    if (lVar6 == 0) {
      lVar6 = 0;
      uVar5 = 0;
    }
    else if ((int)(uint)lVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      uVar3 = (uint)lVar6 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_outputshape_cached_byte_size_ = (int)lVar6;
  sVar8 = uVar5 + lVar6;
  if (this->seed_ != 0) {
    uVar5 = this->seed_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  sVar9 = sVar8;
  if (this->prob_ != 0.0) {
    sVar9 = sVar8 + 5;
  }
  if (NAN(this->prob_)) {
    sVar9 = sVar8 + 5;
  }
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t RandomBernoulliStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomBernoulliStaticLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // int64 seed = 1;
  if (this->seed() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->seed());
  }

  // float prob = 2;
  if (this->prob() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}